

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O0

void __thiscall
TPZEigenAnalysis::TPZEigenAnalysis
          (TPZEigenAnalysis *this,TPZCompMesh *mesh,bool mustOptimizeBandwidth,ostream *out)

{
  TPZFMatrix<std::complex<double>_> *in_RSI;
  undefined8 *in_RDI;
  int64_t in_stack_00000018;
  TPZManVector<std::complex<double>,_10> *in_stack_00000020;
  ostream *in_stack_000000d0;
  bool in_stack_000000df;
  TPZCompMesh *in_stack_000000e0;
  void **in_stack_000000e8;
  TPZAnalysis *in_stack_000000f0;
  
  TPZAnalysis::TPZAnalysis
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000df,
             in_stack_000000d0);
  *in_RDI = &PTR__TPZEigenAnalysis_0252c740;
  TPZManVector<std::complex<double>,_10>::TPZManVector(in_stack_00000020,in_stack_00000018);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(in_RSI);
  *(undefined1 *)(in_RDI + 0x93) = 1;
  return;
}

Assistant:

TPZEigenAnalysis::TPZEigenAnalysis(TPZCompMesh *mesh,
                                   bool mustOptimizeBandwidth, std::ostream &out)
  : TPZAnalysis(mesh, mustOptimizeBandwidth,out)
{

}